

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

void __thiscall CoreML::Model::Model(Model *this,string *description)

{
  element_type *peVar1;
  string *psVar2;
  ModelDescription *this_00;
  Metadata *this_01;
  
  Model(this);
  peVar1 = (this->m_spec).
           super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = peVar1->description_;
  if (this_00 == (ModelDescription *)0x0) {
    this_00 = (ModelDescription *)operator_new(0x78);
    Specification::ModelDescription::ModelDescription(this_00);
    peVar1->description_ = this_00;
  }
  this_01 = this_00->metadata_;
  if (this_01 == (Metadata *)0x0) {
    this_01 = (Metadata *)operator_new(0x58);
    Specification::Metadata::Metadata(this_01);
    this_00->metadata_ = this_01;
  }
  psVar2 = (this_01->shortdescription_).ptr_;
  if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this_01->shortdescription_,description);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  return;
}

Assistant:

Model::Model(const std::string& description)
    : Model::Model() {
        Specification::Metadata* metadata = m_spec->mutable_description()->mutable_metadata();
        metadata->set_shortdescription(description);
    }